

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void * list_remove(List *list,uint index)

{
  uint uVar1;
  list_node_ *plVar2;
  void *pvVar3;
  int iVar4;
  ListNode *__ptr;
  
  uVar1 = list->size;
  if (index < uVar1) {
    __ptr = list->head;
    if (__ptr != (ListNode *)0x0) {
      iVar4 = index + 1;
      do {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) goto LAB_00102c71;
        __ptr = __ptr->next;
      } while (__ptr != (list_node_ *)0x0);
    }
    __ptr = (ListNode *)0x0;
LAB_00102c71:
    if (__ptr != (ListNode *)0x0) {
      if (index == 0) {
        list->head = __ptr->next;
      }
      else if (uVar1 - 1 == index) {
        plVar2 = __ptr->prev;
        list->tail = plVar2;
        plVar2->next = (list_node_ *)0x0;
      }
      else {
        plVar2 = __ptr->prev;
        plVar2->next = __ptr->next;
        __ptr->next->prev = plVar2;
      }
      list->size = uVar1 - 1;
      pvVar3 = __ptr->data;
      free(__ptr);
      if (list->size != 0) {
        return pvVar3;
      }
      list->head = (ListNode *)0x0;
      list->tail = (ListNode *)0x0;
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void* list_remove(List * list, unsigned int index){
    if (index >= list->size){
        return NULL;
    }
    ListNode *node = list_get_(list, index);
    if (node == NULL)
        return NULL;
    if (index == 0){
        /**
         * 删除头
         */
        list->head = node->next;
    }else if (index == list->size - 1){
        // 删除尾
        list->tail = node->prev;
        node->prev->next = NULL;
    }else{
        node->prev->next = node->next;
        node->next->prev = node->prev;
    }
    list->size --;
    void* data = node->data;
    free(node);
    // 防止出现野指针
    if (list->size == 0){
        list->head = list->tail = NULL;
    }
    return data;
}